

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

string * __thiscall
spvtools::opt::analysis::Function::str_abi_cxx11_(string *__return_storage_ptr__,Function *this)

{
  const_reference ppTVar1;
  ostream *poVar2;
  string local_1e0 [32];
  string local_1c0 [32];
  size_type local_1a0;
  size_t i;
  size_t count;
  ostringstream oss;
  Function *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&count);
  i = std::
      vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
      ::size(&this->param_types_);
  std::operator<<((ostream *)&count,"(");
  for (local_1a0 = 0; local_1a0 < i; local_1a0 = local_1a0 + 1) {
    ppTVar1 = std::
              vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ::operator[](&this->param_types_,local_1a0);
    (*(*ppTVar1)->_vptr_Type[3])(local_1c0);
    std::operator<<((ostream *)&count,local_1c0);
    std::__cxx11::string::~string(local_1c0);
    if (local_1a0 + 1 != i) {
      std::operator<<((ostream *)&count,", ");
    }
  }
  poVar2 = std::operator<<((ostream *)&count,") -> ");
  (*this->return_type_->_vptr_Type[3])(local_1e0);
  std::operator<<(poVar2,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&count);
  return __return_storage_ptr__;
}

Assistant:

std::string Function::str() const {
  std::ostringstream oss;
  const size_t count = param_types_.size();
  oss << "(";
  for (size_t i = 0; i < count; ++i) {
    oss << param_types_[i]->str();
    if (i + 1 != count) oss << ", ";
  }
  oss << ") -> " << return_type_->str();
  return oss.str();
}